

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCopyNode(void)

{
  int iVar1;
  int iVar2;
  xmlNodePtr val;
  xmlNodePtr val_00;
  int local_2c;
  int n_extended;
  int extended;
  int n_node;
  xmlNodePtr node;
  xmlNodePtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (n_extended = 0; n_extended < 3; n_extended = n_extended + 1) {
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlNodePtr(n_extended,0);
      iVar2 = gen_int(local_2c,1);
      val_00 = (xmlNodePtr)xmlCopyNode(val,iVar2);
      desret_xmlNodePtr(val_00);
      call_tests = call_tests + 1;
      des_xmlNodePtr(n_extended,val,0);
      des_int(local_2c,iVar2,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyNode",(ulong)(uint)(iVar2 - iVar1));
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)(uint)n_extended);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlCopyNode(void) {
    int test_ret = 0;

    int mem_base;
    xmlNodePtr ret_val;
    xmlNodePtr node; /* the node */
    int n_node;
    int extended; /* if 1 do a recursive copy (properties, namespaces and children when applicable) if 2 copy properties and namespaces (when applicable) */
    int n_extended;

    for (n_node = 0;n_node < gen_nb_xmlNodePtr;n_node++) {
    for (n_extended = 0;n_extended < gen_nb_int;n_extended++) {
        mem_base = xmlMemBlocks();
        node = gen_xmlNodePtr(n_node, 0);
        extended = gen_int(n_extended, 1);

        ret_val = xmlCopyNode(node, extended);
        desret_xmlNodePtr(ret_val);
        call_tests++;
        des_xmlNodePtr(n_node, node, 0);
        des_int(n_extended, extended, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCopyNode",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_node);
            printf(" %d", n_extended);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}